

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128AsmJsLowerStoreElem(LowererMD *this,Instr *instr)

{
  byte dataWidth_00;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  byte bVar4;
  ValueType arrType_00;
  int32 iVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  IndirOpnd *pIVar9;
  RegOpnd *pRVar10;
  RegOpnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  IntConstOpnd *this_03;
  Instr *pIVar11;
  uint32 bpe;
  Instr *done;
  uint8 dataWidth;
  ValueType arrType;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  Instr *instrPrev;
  Instr *instr_local;
  LowererMD *this_local;
  
  if ((((((((instr->m_opcode != Simd128_StArr_I4) && (instr->m_opcode != Simd128_StArr_I8)) &&
          (instr->m_opcode != Simd128_StArr_I16)) &&
         ((instr->m_opcode != Simd128_StArr_U4 && (instr->m_opcode != Simd128_StArr_U8)))) &&
        ((instr->m_opcode != Simd128_StArr_U16 &&
         ((instr->m_opcode != Simd128_StArr_F4 && (instr->m_opcode != Simd128_StArrConst_I4)))))) &&
       (instr->m_opcode != Simd128_StArrConst_I8)) &&
      (((instr->m_opcode != Simd128_StArrConst_I16 && (instr->m_opcode != Simd128_StArrConst_U4)) &&
       (instr->m_opcode != Simd128_StArrConst_U8)))) &&
     (((instr->m_opcode != Simd128_StArrConst_U16 && (instr->m_opcode != Simd128_StArrConst_U4)) &&
      (instr->m_opcode != Simd128_StArrConst_F4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xac8,
                       "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 || instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pIVar11 = instr->m_prev;
  pOVar8 = IR::Instr::GetDst(instr);
  pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
  pRVar10 = IR::IndirOpnd::GetIndexOpnd(pIVar9);
  pOVar8 = IR::Instr::GetDst(instr);
  pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
  this_00 = IR::IndirOpnd::GetBaseOpnd(pIVar9);
  pOVar8 = IR::Instr::GetDst(instr);
  this_01 = IR::Instr::GetSrc1(instr);
  this_02 = IR::Instr::GetSrc2(instr);
  arrType_00 = IR::Opnd::GetValueType(&this_00->super_Opnd);
  dataWidth_00 = instr->dataWidth;
  bVar2 = IR::Opnd::IsSimd128(pOVar8);
  if (((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(this_01), !bVar2)) ||
     (IVar3 = IR::Opnd::GetType(this_02), IVar3 != TyUint32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xad4,
                       "(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32)",
                       "dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pRVar10 == (RegOpnd *)0x0) {
    pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
    iVar5 = IR::IndirOpnd::GetOffset(pIVar9);
    if (iVar5 + (uint)dataWidth_00 < 0x1000001) {
      bVar2 = IR::Opnd::IsIntConstOpnd(this_02);
      if (bVar2) {
        pIVar9 = IR::Opnd::AsIndirOpnd(pOVar8);
        iVar5 = IR::IndirOpnd::GetOffset(pIVar9);
        this_03 = IR::Opnd::AsIntConstOpnd(this_02);
        uVar6 = IR::IntConstOpnd::AsUint32(this_03);
        if (uVar6 < iVar5 + (uint)dataWidth_00) {
          Lowerer::GenerateRuntimeError
                    (this->m_lowerer,instr,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
          IR::Instr::Remove(instr);
          return pIVar11;
        }
      }
      goto LAB_008a6044;
    }
  }
  bVar4 = Simd128GetTypedArrBytesPerElem(this,arrType_00);
  LowererMDArch::LowerAsmJsStElemHelper(&this->lowererMDArch,instr,true,bVar4 != dataWidth_00);
LAB_008a6044:
  pIVar11 = Simd128ConvertToStore(this,pOVar8,this_01,dataWidth_00,instr,'\0');
  return pIVar11;
}

Assistant:

IR::Instr*
LowererMD::Simd128AsmJsLowerStoreElem(IR::Instr *instr)
{
    Assert(
        instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArr_F4 ||
        //instr->m_opcode == Js::OpCode::Simd128_StArr_D2 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_I16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U8 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_U4 ||
        instr->m_opcode == Js::OpCode::Simd128_StArrConst_F4
        //instr->m_opcode == Js::OpCode::Simd128_StArrConst_D2
        );

    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * indexOpnd = instr->GetDst()->AsIndirOpnd()->GetIndexOpnd();
    IR::RegOpnd * baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();
    ValueType arrType = baseOpnd->GetValueType();
    uint8 dataWidth = instr->dataWidth;

    // Type-specialized.
    Assert(dst->IsSimd128() && src1->IsSimd128() && src2->GetType() == TyUint32);

    IR::Instr * done;

    if (indexOpnd || ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > 0x1000000))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $store
        // $helper:
        // Throw RangeError
        // JMP $done
        // $store:
        // MOV dst([arrayBuffer + indexOpnd]), src1
        // $done:
        uint32 bpe = Simd128GetTypedArrBytesPerElem(arrType);
        done = this->lowererMDArch.LowerAsmJsStElemHelper(instr, true, bpe != dataWidth);
    }
    else
    {
        // we might have a constant index if globopt propped a constant store. we can ahead of time check if it is in-bounds
        if (src2->IsIntConstOpnd() && ((uint32)dst->AsIndirOpnd()->GetOffset() + dataWidth > src2->AsIntConstOpnd()->AsUint32()))
        {
            m_lowerer->GenerateRuntimeError(instr, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);
            instr->Remove();
            return instrPrev;
        }
        done = instr;
    }

    return Simd128ConvertToStore(dst, src1, dataWidth, instr);
}